

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRStereoNode::VRStereoNode
          (VRStereoNode *this,string *name,float interOcularDist,VRGraphicsToolkit *gfxToolkit,
          VRStereoFormat format)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_5d;
  float local_5c;
  value_type local_58;
  string local_38;
  
  local_5c = interOcularDist;
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRStereoNode_0015d908;
  this->_gfxToolkit = gfxToolkit;
  this->_format = format;
  this->_iod = local_5c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"HeadMatrix",(allocator<char> *)&local_58);
  VRDisplayNode::_addValueNeeded(&this->super_VRDisplayNode,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"CameraMatrix",&local_5d);
  this_00 = &(this->super_VRDisplayNode)._valuesAdded;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Eye",&local_5d);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"StereoFormat",&local_5d);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

VRStereoNode::VRStereoNode(const std::string &name, float interOcularDist, VRGraphicsToolkit *gfxToolkit, VRStereoFormat format) :
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _format(format), _iod(interOcularDist) {

  // in:
  _addValueNeeded("HeadMatrix");

  // out:
  _valuesAdded.push_back("CameraMatrix");
  _valuesAdded.push_back("Eye");
  _valuesAdded.push_back("StereoFormat");

  // There are also some conditional requirements such as "ViewportX" that we
  // only need under some conditions.  These are checked for below.
}